

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink.h
# Opt level: O0

double __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex>::log
          (ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex> *this,
          double __x)

{
  pointer pfVar1;
  mapped_type *color_code;
  size_t end;
  size_t sVar2;
  long in_RSI;
  double extraout_XMM0_Qa;
  allocator<char> local_239;
  undefined1 local_238 [8];
  memory_buffer formatted;
  lock_guard<std::mutex> lock;
  log_msg *msg_local;
  ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex> *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)(formatted.store_ + 0x1f0),this->mutex_);
  std::allocator<char>::allocator();
  ::fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_238,&local_239);
  std::allocator<char>::~allocator(&local_239);
  pfVar1 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     (&(this->super_sink).formatter_);
  (*pfVar1->_vptr_formatter[2])(pfVar1,in_RSI,local_238);
  if (((this->should_do_colors_ & 1U) == 0) ||
     (*(ulong *)(in_RSI + 0x30) <= *(ulong *)(in_RSI + 0x28))) {
    sVar2 = ::fmt::v5::internal::basic_buffer<char>::size((basic_buffer<char> *)local_238);
    print_range_(this,(memory_buffer *)local_238,0,sVar2);
  }
  else {
    print_range_(this,(memory_buffer *)local_238,0,*(size_t *)(in_RSI + 0x28));
    color_code = std::
                 unordered_map<spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<spdlog::level::level_enum>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->colors_,(key_type *)(in_RSI + 8));
    print_ccode_(this,color_code);
    print_range_(this,(memory_buffer *)local_238,*(size_t *)(in_RSI + 0x28),
                 *(size_t *)(in_RSI + 0x30));
    print_ccode_(this,&this->reset);
    sVar2 = *(size_t *)(in_RSI + 0x30);
    end = ::fmt::v5::internal::basic_buffer<char>::size((basic_buffer<char> *)local_238);
    print_range_(this,(memory_buffer *)local_238,sVar2,end);
  }
  fflush((FILE *)this->target_file_);
  ::fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_238);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)(formatted.store_ + 0x1f0));
  return extraout_XMM0_Qa;
}

Assistant:

void log(const details::log_msg &msg) override
    {
        // Wrap the originally formatted message in color codes.
        // If color is not supported in the terminal, log as is instead.
        std::lock_guard<mutex_t> lock(mutex_);

        fmt::memory_buffer formatted;
        formatter_->format(msg, formatted);
        if (should_do_colors_ && msg.color_range_end > msg.color_range_start)
        {
            // before color range
            print_range_(formatted, 0, msg.color_range_start);
            // in color range
            print_ccode_(colors_[msg.level]);
            print_range_(formatted, msg.color_range_start, msg.color_range_end);
            print_ccode_(reset);
            // after color range
            print_range_(formatted, msg.color_range_end, formatted.size());
        }
        else // no color
        {
            print_range_(formatted, 0, formatted.size());
        }
        fflush(target_file_);
    }